

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_fma.cpp
# Opt level: O3

int __thiscall ncnn::Convolution_x86_fma::create_pipeline(Convolution_x86_fma *this,Option *opt)

{
  _func_int *p_Var1;
  uint kernel_w;
  uint kernel_h;
  int *piVar2;
  Allocator *pAVar3;
  void *pvVar4;
  long *plVar5;
  ulong uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  _func_int **pp_Var9;
  Layer *pLVar10;
  bool bVar11;
  char cVar12;
  Mat *pMVar13;
  int iVar14;
  uint uVar15;
  Option *pOVar16;
  int iVar17;
  int iVar18;
  uint num_input;
  _func_int *p_Var19;
  long lVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  byte bVar24;
  bool bVar25;
  ParamDict pd_5;
  ParamDict pd;
  undefined1 local_c8 [8];
  int local_c0;
  Allocator *local_b8;
  int iStack_b0;
  int iStack_ac;
  size_t sStack_a8;
  int local_a0 [2];
  size_t local_98 [2];
  undefined4 uStack_88;
  undefined4 uStack_84;
  size_t local_80;
  undefined4 local_78;
  undefined8 local_70;
  undefined4 uStack_68;
  undefined4 uStack_64;
  size_t sStack_60;
  undefined4 local_58;
  undefined8 local_50;
  ModelBinFromMatArray local_40;
  
  pp_Var9 = this->_vptr_Convolution_x86_fma;
  p_Var19 = pp_Var9[-3];
  if (*(int *)((long)&(this->weight_winograd63_data).dims + (long)p_Var19) != 0) {
    return 0;
  }
  switch(*(undefined4 *)((long)&(this->weight_winograd43_data).allocator + (long)(p_Var19 + 4))) {
  case 1:
    pLVar10 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    (*pLVar10->_vptr_Layer[2])(pLVar10,&pd);
    break;
  case 2:
    pLVar10 = create_layer(0x1a);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)((long)&(this->weight_winograd43_data).dims + (long)p_Var19));
    (*pLVar10->_vptr_Layer[2])(pLVar10,&pd);
    break;
  case 3:
    pLVar10 = create_layer(0x36);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)((long)&(this->weight_winograd43_data).dims + (long)p_Var19));
    ParamDict::set(&pd,1,*(float *)(*(long *)((long)&(this->weight_winograd43_data).dims +
                                             (long)p_Var19) + 4));
    (*pLVar10->_vptr_Layer[2])(pLVar10,&pd);
    break;
  case 4:
    pLVar10 = create_layer(0x1e);
    ParamDict::ParamDict(&pd);
    (*pLVar10->_vptr_Layer[2])(pLVar10,&pd);
    break;
  case 5:
    pLVar10 = create_layer(0x47);
    ParamDict::ParamDict(&pd);
    (*pLVar10->_vptr_Layer[2])(pLVar10,&pd);
    break;
  case 6:
    pLVar10 = create_layer(0x43);
    ParamDict::ParamDict(&pd);
    ParamDict::set(&pd,0,**(float **)((long)&(this->weight_winograd43_data).dims + (long)p_Var19));
    ParamDict::set(&pd,1,*(float *)(*(long *)((long)&(this->weight_winograd43_data).dims +
                                             (long)p_Var19) + 4));
    (*pLVar10->_vptr_Layer[2])(pLVar10,&pd);
    break;
  default:
    pLVar10 = (Layer *)0x0;
    goto LAB_00207291;
  }
  ParamDict::~ParamDict(&pd);
  (*pLVar10->_vptr_Layer[4])(pLVar10);
  pp_Var9 = this->_vptr_Convolution_x86_fma;
LAB_00207291:
  this->activation = pLVar10;
  p_Var19 = pp_Var9[-3];
  if ((opt->use_int8_inference == true) &&
     (*(long *)((long)&(this->weight_winograd63_data).cstep + (long)p_Var19) == 1)) {
    create_pipeline_int8_x86(this,opt);
    return 0;
  }
  uVar15 = *(uint *)((long)&(this->weight_winograd23_data).h + (long)p_Var19);
  kernel_w = *(uint *)((long)&(this->weight_winograd23_data).d + (long)p_Var19);
  pOVar16 = (Option *)(ulong)kernel_w;
  kernel_h = *(uint *)((long)&(this->weight_winograd23_data).c + (long)p_Var19);
  uVar6 = (long)*(int *)(&(this->weight_winograd43_data).field_0x1c + (long)p_Var19) /
          (long)(int)(kernel_h * kernel_w);
  uVar6 = (long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) / (long)(int)uVar15
  ;
  bVar11 = opt->use_packing_layout;
  if ((((kernel_w == kernel_h && bVar11 == false) &&
       (iVar14 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19), iVar14 != 1))
      && (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) == iVar14)) &&
     ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 1 &&
      (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 1)))) {
    pLVar10 = create_layer(6);
    this->convolution_dilation1 = pLVar10;
    ParamDict::ParamDict(&pd_5);
    ParamDict::set(&pd_5,0,*(int *)((long)&(this->weight_winograd23_data).h +
                                   (long)this->_vptr_Convolution_x86_fma[-3]));
    ParamDict::set(&pd_5,1,*(int *)((long)&(this->weight_winograd23_data).d +
                                   (long)this->_vptr_Convolution_x86_fma[-3]));
    ParamDict::set(&pd_5,0xb,
                   *(int *)((long)&(this->weight_winograd23_data).c +
                           (long)this->_vptr_Convolution_x86_fma[-3]));
    ParamDict::set(&pd_5,2,1);
    ParamDict::set(&pd_5,0xc,1);
    ParamDict::set(&pd_5,3,1);
    ParamDict::set(&pd_5,0xd,1);
    ParamDict::set(&pd_5,4,0);
    ParamDict::set(&pd_5,0xe,0);
    ParamDict::set(&pd_5,5,*(int *)((long)&(this->weight_winograd43_data).elempack +
                                   (long)this->_vptr_Convolution_x86_fma[-3]));
    ParamDict::set(&pd_5,6,*(int *)(&(this->weight_winograd43_data).field_0x1c +
                                   (long)this->_vptr_Convolution_x86_fma[-3]));
    (*this->convolution_dilation1->_vptr_Layer[2])(this->convolution_dilation1,&pd_5);
    pp_Var9 = this->_vptr_Convolution_x86_fma;
    if (*(int *)((long)&(this->weight_winograd43_data).elempack + (long)pp_Var9[-3]) == 0) {
      local_98[0] = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      local_c8 = SUB128(ZEXT812(0),4);
      local_c0 = 0;
      local_b8 = (Allocator *)0x0;
      iStack_b0 = 0;
      local_a0[0] = 0;
      p_Var19 = pp_Var9[-3];
      iStack_ac = pd.d._4_4_;
      sStack_a8 = (size_t)local_c8;
      if (&pd != (ParamDict *)((long)&(this->weight_winograd63_data).h + (long)p_Var19)) {
        piVar2 = *(int **)((long)&(this->weight_winograd63_data).c + (long)p_Var19);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict =
             *(_func_int ***)((long)&(this->weight_winograd63_data).h + (long)p_Var19);
        uVar7 = *(undefined8 *)((long)&(this->weight_winograd63_data).c + (long)p_Var19);
        pd.d._0_4_ = (undefined4)uVar7;
        pd.d._4_4_ = (int)((ulong)uVar7 >> 0x20);
        local_c8 = *(undefined1 (*) [8])
                    ((long)&(this->weight_winograd63_data).cstep + (long)p_Var19);
        local_c0 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var19);
        local_b8 = *(Allocator **)((long)&(this->scale_in_data).data + (long)p_Var19);
        uVar7 = *(undefined8 *)((long)&(this->scale_in_data).refcount + (long)p_Var19);
        sStack_a8 = *(size_t *)((long)&(this->scale_in_data).elemsize + (long)p_Var19);
        iStack_b0 = (int)uVar7;
        iStack_ac = (int)((ulong)uVar7 >> 0x20);
        local_a0[0] = *(int *)((long)&(this->scale_in_data).elempack + (long)p_Var19);
        local_98[0] = *(size_t *)((long)&(this->scale_in_data).allocator + (long)p_Var19);
      }
      pLVar10 = this->convolution_dilation1;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_40,(Mat *)&pd);
      (*pLVar10->_vptr_Layer[3])(pLVar10,&local_40);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_40);
      piVar2 = (int *)CONCAT44(pd.d._4_4_,pd.d._0_4_);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if (local_b8 == (Allocator *)0x0) {
            if (pd._vptr_ParamDict != (_func_int **)0x0) {
              free(pd._vptr_ParamDict);
            }
          }
          else {
            (*local_b8->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      local_98[0] = 0;
      pd._vptr_ParamDict = (_func_int **)0x0;
      pd.d._0_4_ = 0;
      pd.d._4_4_ = 0;
      local_c8 = SUB128(ZEXT812(0),4);
      local_c0 = 0;
      local_b8 = (Allocator *)0x0;
      iStack_b0 = 0;
      local_a0[0] = 0;
      p_Var19 = pp_Var9[-3];
      iStack_ac = pd.d._4_4_;
      sStack_a8 = (size_t)local_c8;
      sStack_60 = (size_t)local_c8;
      if (&pd != (ParamDict *)((long)&(this->weight_winograd63_data).h + (long)p_Var19)) {
        piVar2 = *(int **)((long)&(this->weight_winograd63_data).c + (long)p_Var19);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        pd._vptr_ParamDict =
             *(_func_int ***)((long)&(this->weight_winograd63_data).h + (long)p_Var19);
        uVar7 = *(undefined8 *)((long)&(this->weight_winograd63_data).c + (long)p_Var19);
        pd.d._0_4_ = (undefined4)uVar7;
        pd.d._4_4_ = (int)((ulong)uVar7 >> 0x20);
        local_c8 = *(undefined1 (*) [8])
                    ((long)&(this->weight_winograd63_data).cstep + (long)p_Var19);
        local_c0 = *(int *)((long)&this->convolution_dilation1 + (long)p_Var19);
        local_b8 = *(Allocator **)((long)&(this->scale_in_data).data + (long)p_Var19);
        uVar7 = *(undefined8 *)((long)&(this->scale_in_data).refcount + (long)p_Var19);
        sStack_a8 = *(size_t *)((long)&(this->scale_in_data).elemsize + (long)p_Var19);
        iStack_b0 = (int)uVar7;
        iStack_ac = (int)((ulong)uVar7 >> 0x20);
        local_a0[0] = *(int *)((long)&(this->scale_in_data).elempack + (long)p_Var19);
        local_98[0] = *(size_t *)((long)&(this->scale_in_data).allocator + (long)p_Var19);
        p_Var19 = this->_vptr_Convolution_x86_fma[-3];
      }
      local_50 = 0;
      local_58 = 0;
      uStack_64 = 0;
      uStack_68 = 0;
      local_70 = 0;
      local_78 = 0;
      uStack_84 = 0;
      uStack_88 = 0;
      local_98[1] = 0;
      local_80 = sStack_60;
      if ((_func_int *)(local_98 + 1) !=
          (_func_int *)((long)&(this->scale_in_data).dims + (long)p_Var19)) {
        piVar2 = *(int **)((long)&(this->scale_in_data).h + (long)p_Var19);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        local_98[1] = *(size_t *)((long)&(this->scale_in_data).dims + (long)p_Var19);
        uVar7 = *(undefined8 *)((long)&(this->scale_in_data).h + (long)p_Var19);
        uStack_88 = (undefined4)uVar7;
        uStack_84 = (undefined4)((ulong)uVar7 >> 0x20);
        local_80 = *(size_t *)((long)&(this->scale_in_data).c + (long)p_Var19);
        local_78 = *(undefined4 *)((long)&(this->scale_in_data).cstep + (long)p_Var19);
        local_70 = *(undefined8 *)(&this->field_0x1c8 + (long)p_Var19);
        sStack_60 = *(size_t *)(&this->field_0x1d8 + (long)p_Var19);
        uStack_68 = (undefined4)*(undefined8 *)(&this->field_0x1d0 + (long)p_Var19);
        uStack_64 = (undefined4)((ulong)*(undefined8 *)(&this->field_0x1d0 + (long)p_Var19) >> 0x20)
        ;
        local_58 = *(undefined4 *)(&this->field_0x1e0 + (long)p_Var19);
        local_50 = *(undefined8 *)(&this->field_0x1e8 + (long)p_Var19);
      }
      pLVar10 = this->convolution_dilation1;
      ModelBinFromMatArray::ModelBinFromMatArray(&local_40,(Mat *)&pd);
      (*pLVar10->_vptr_Layer[3])(pLVar10,&local_40);
      ModelBinFromMatArray::~ModelBinFromMatArray(&local_40);
      lVar20 = 0x48;
      do {
        piVar2 = *(int **)((long)&pd.d + lVar20);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            pvVar4 = *(void **)((long)&pd._vptr_ParamDict + lVar20);
            if (*(long **)((long)&local_b8 + lVar20) == (long *)0x0) {
              if (pvVar4 != (void *)0x0) {
                free(pvVar4);
              }
            }
            else {
              (**(code **)(**(long **)((long)&local_b8 + lVar20) + 0x18))();
            }
          }
        }
        *(undefined8 *)((long)local_98 + lVar20) = 0;
        *(undefined8 *)((long)&pd.d + lVar20 + 4) = 0;
        *(undefined8 *)(local_c8 + lVar20 + 4) = 0;
        *(undefined8 *)((long)&pd._vptr_ParamDict + lVar20) = 0;
        *(undefined8 *)((long)&pd.d + lVar20) = 0;
        *(undefined8 *)((long)&iStack_b0 + lVar20) = 0;
        *(undefined8 *)((long)local_a0 + lVar20 + -8) = 0;
        *(undefined4 *)((long)local_a0 + lVar20) = 0;
        lVar20 = lVar20 + -0x48;
      } while (lVar20 != -0x48);
    }
    (*this->convolution_dilation1->_vptr_Layer[4])(this->convolution_dilation1,opt);
    if (opt->lightmode == true) {
      p_Var19 = this->_vptr_Convolution_x86_fma[-3];
      piVar2 = *(int **)((long)&(this->weight_winograd63_data).c + (long)p_Var19);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          pvVar4 = *(void **)((long)&(this->weight_winograd63_data).h + (long)p_Var19);
          plVar5 = *(long **)((long)&(this->scale_in_data).data + (long)p_Var19);
          if (plVar5 == (long *)0x0) {
            if (pvVar4 != (void *)0x0) {
              free(pvVar4);
            }
          }
          else {
            (**(code **)(*plVar5 + 0x18))();
          }
        }
      }
      *(undefined8 *)((long)&(this->scale_in_data).allocator + (long)p_Var19) = 0;
      *(undefined8 *)(&(this->weight_winograd63_data).field_0x3c + (long)p_Var19) = 0;
      *(undefined8 *)((long)&(this->weight_winograd63_data).cstep + (long)(p_Var19 + 4)) = 0;
      *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var19) = 0;
      *(undefined8 *)((long)&(this->weight_winograd63_data).c + (long)p_Var19) = 0;
      *(undefined8 *)((long)&(this->scale_in_data).refcount + (long)p_Var19) = 0;
      *(undefined8 *)((long)&(this->scale_in_data).elemsize + (long)p_Var19) = 0;
      *(undefined4 *)((long)&(this->scale_in_data).elempack + (long)p_Var19) = 0;
    }
    ParamDict::~ParamDict(&pd_5);
    return 0;
  }
  num_input = (uint)uVar6;
  if (bVar11 == false) {
    cVar12 = '\x01';
    bVar21 = false;
LAB_002079db:
    bVar24 = bVar11 ^ 1;
    bVar22 = false;
    bVar11 = false;
LAB_002079e4:
    bVar23 = cVar12 == '\x01';
    if ((!bVar21) || (cVar12 != '\x01')) goto LAB_00207d82;
    p_Var19 = this->_vptr_Convolution_x86_fma[-3];
    uVar15 = *(uint *)((long)&(this->weight_winograd23_data).d + (long)p_Var19);
    if (uVar15 == 3) {
      if (((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var19) == 3) &&
          (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) == 1)) &&
         ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) == 1 &&
          ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 1 &&
           (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 1)))))) {
        if ((opt->use_winograd_convolution == true) && (opt->use_winograd63_convolution == true)) {
          conv3x3s1_winograd63_transform_kernel_pack8to1_avx
                    ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                     &this->weight_winograd63_data,num_input,
                     *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19),
                     (Option *)(ulong)uVar15);
        }
        else {
          iVar17 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19);
          uVar15 = 3;
          iVar14 = 3;
LAB_00207b5d:
          convolution_transform_kernel_packed_sse
                    ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                     &this->weight_data_tm,num_input,iVar17,uVar15,iVar14,8,1);
        }
      }
      else {
LAB_00207b26:
        iVar17 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19);
        iVar14 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var19);
        if (opt->use_sgemm_convolution != true) goto LAB_00207b5d;
        convolution_im2col_sgemm_transform_kernel_pack8to1_avx
                  ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                   &this->weight_sgemm_data,num_input,iVar17,uVar15,iVar14);
      }
      bVar23 = true;
    }
    else {
      if (((uVar15 != 1) || (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var19) != 1)
          ) || (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) != 1 ||
                 (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) != 1 ||
                   (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) != 1
                   )) || (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) != 1)
                  ))) && ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) !=
                             1 || (*(int *)((long)&(this->weight_winograd23_data).cstep +
                                           (long)p_Var19) != 1)) ||
                           (*(int *)((long)&(this->weight_winograd23_data).cstep +
                                    (long)(p_Var19 + 4)) != 2)) ||
                          (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) != 2
                          )))))) goto LAB_00207b26;
      convolution_im2col_sgemm_transform_kernel_pack8to1_avx
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                 &this->weight_sgemm_data,num_input,
                 *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19),1,1);
      bVar23 = true;
    }
  }
  else {
    bVar21 = (uVar6 & 7) == 0;
    cVar12 = '\b';
    if ((uVar15 & 7) != 0) {
      cVar12 = ((uVar15 & 3) == 0) * '\x03' + '\x01';
    }
    if (((num_input | uVar15) & 7) == 0) {
      if (((kernel_h == 1 && kernel_w == 1) &&
          (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) == 1)) &&
         (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) == 1 &&
           ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 1 &&
            (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 1)))) ||
          ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) == 1 &&
           ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 2 &&
            (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 2)))))))) {
        convolution_im2col_sgemm_transform_kernel_pack8_avx
                  ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                   &this->weight_sgemm_data,num_input,uVar15,1,1);
        cVar12 = '\b';
        goto LAB_002079db;
      }
      if ((opt->use_winograd_convolution == true) &&
         (((bVar22 = opt->use_winograd23_convolution, bVar22 != false ||
           (opt->use_winograd43_convolution != false)) || (opt->use_winograd63_convolution == true))
         )) {
        if (kernel_w != 2) {
          if (((kernel_w != 3) || (kernel_h != 3)) ||
             (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) != 1))
          goto LAB_00207992;
          if (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) != 1) ||
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) != 1)) ||
             (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) != 1)) {
LAB_002078af:
            if (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) != 1) ||
                (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) != 1))
               || (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) != 1))
            goto LAB_00207992;
            iVar14 = 3;
            iVar17 = 3;
            goto LAB_0020797a;
          }
          if ((int)num_input < 9) {
            if ((int)uVar15 < 9) goto LAB_002078af;
            cVar12 = opt->use_winograd63_convolution;
            bVar23 = false;
LAB_00208aff:
            if (opt->use_winograd43_convolution == false) {
              if (bVar22 != false) goto LAB_00208b36;
              goto LAB_00208b51;
            }
            if (((bool)(0xf < (int)uVar15 & bVar23)) || (cVar12 == '\0' && bVar22 == false)) {
              conv3x3s1_winograd43_transform_kernel_pack8_avx
                        ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                         &this->weight_winograd43_data,num_input,uVar15,pOVar16);
            }
            else {
LAB_00208b36:
              conv3x3s1_winograd23_transform_kernel_pack8_avx
                        ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                         &this->weight_winograd23_data,num_input,uVar15,pOVar16);
            }
          }
          else {
            cVar12 = opt->use_winograd63_convolution;
            bVar23 = 0xf < num_input;
            if (((bool)cVar12 != true) || (num_input < 0x10)) goto LAB_00208aff;
            bVar23 = true;
            if (0x30 < uVar15 - 0x10) {
              cVar12 = '\x01';
              goto LAB_00208aff;
            }
            cVar12 = '\x01';
            if (0x40 < num_input) goto LAB_00208aff;
LAB_00208b51:
            conv3x3s1_winograd63_transform_kernel_pack8_avx
                      ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                       &this->weight_winograd63_data,num_input,uVar15,pOVar16);
          }
          cVar12 = '\b';
          goto LAB_002079db;
        }
LAB_00207928:
        if ((((kernel_h == 2) &&
             (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) == 1)) &&
            (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) == 1)) &&
           ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 1 &&
            (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 1)))) {
          iVar14 = 2;
          iVar17 = 2;
LAB_0020797a:
          cVar12 = '\b';
          convolution_transform_kernel_packed_sse
                    ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                     &this->weight_data_tm,num_input,uVar15,iVar14,iVar17,8,8);
          goto LAB_002079db;
        }
      }
      else {
        if (kernel_w == 2) goto LAB_00207928;
        if (((kernel_w == 3) && (kernel_h == 3)) &&
           (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) == 1))
        goto LAB_002078af;
      }
LAB_00207992:
      pMVar13 = (Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19);
      if (opt->use_sgemm_convolution == true) {
        convolution_im2col_sgemm_transform_kernel_pack8_avx
                  (pMVar13,&this->weight_sgemm_data,num_input,uVar15,kernel_w,kernel_h);
      }
      else {
        convolution_transform_kernel_packed_sse
                  (pMVar13,&this->weight_data_tm,num_input,uVar15,kernel_w,kernel_h,8,8);
      }
      cVar12 = '\b';
      goto LAB_002079db;
    }
    bVar22 = (uVar6 & 7) != 0;
    bVar23 = (uVar6 & 3) == 0;
    bVar11 = bVar23 && bVar22;
    if (((uVar15 & 7) == 0) && (bVar23 && bVar22)) {
      if ((kernel_h == 1 && kernel_w == 1) &&
         ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) == 1 &&
            (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) == 1)) &&
           ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 1 &&
            (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 1)))) ||
          ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) == 1 &&
             (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) == 1)) &&
            (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 2)) &&
           (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 2)))))) {
        convolution_im2col_sgemm_transform_kernel_pack4to8_avx
                  ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                   &this->weight_sgemm_data,num_input,uVar15,1,1);
        bVar11 = true;
        bVar24 = false;
      }
      else {
        pMVar13 = (Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19);
        if (opt->use_sgemm_convolution == true) {
          convolution_im2col_sgemm_transform_kernel_pack4to8_avx
                    (pMVar13,&this->weight_sgemm_data,num_input,uVar15,kernel_w,kernel_h);
        }
        else {
          convolution_transform_kernel_packed_sse
                    (pMVar13,&this->weight_data_tm,num_input,uVar15,kernel_w,kernel_h,4,8);
        }
        bVar11 = true;
        bVar24 = false;
      }
    }
    else {
      bVar24 = (uVar6 & 3) != 0;
      if (((uVar15 & 7) == 0) && ((bool)bVar24)) {
        p_Var19 = this->_vptr_Convolution_x86_fma[-3];
        iVar14 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var19);
        if (iVar14 == 3) {
          if ((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var19) != 3) ||
             (((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) != 1 ||
                 (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) != 1)) ||
                (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) != 1))
               || (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) != 1)) &&
              (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) != 1 ||
                (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) != 1)) ||
               ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) != 2 ||
                (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) != 2))))))))
          goto LAB_00207c15;
          convolution_transform_kernel_packed_sse
                    ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                     &this->weight_data_tm,num_input,
                     *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19),3,3,1,8);
        }
        else {
          if (((iVar14 != 1) ||
              (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var19) != 1)) ||
             (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) != 1 ||
               (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) != 1 ||
                 (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) != 1))
                || (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) != 1)))) &&
              ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) != 1 ||
                 (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) != 1)) ||
                (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) != 2))
               || (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) != 2)))))) {
LAB_00207c15:
            pMVar13 = (Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19);
            iVar17 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19);
            iVar18 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var19);
            if (opt->use_sgemm_convolution == true) {
              convolution_im2col_sgemm_transform_kernel_pack1to8_avx
                        (pMVar13,&this->weight_sgemm_data,num_input,iVar17,iVar14,iVar18);
            }
            else {
              convolution_transform_kernel_packed_sse
                        (pMVar13,&this->weight_data_tm,num_input,iVar17,iVar14,iVar18,1,8);
            }
            bVar24 = true;
            goto LAB_00207c75;
          }
          convolution_im2col_sgemm_transform_kernel_pack1to8_avx
                    ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                     &this->weight_sgemm_data,num_input,
                     *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19),1,1);
        }
        bVar24 = true;
      }
    }
LAB_00207c75:
    bVar23 = (uVar15 & 3) == 0;
    bVar25 = (uVar15 & 7) != 0;
    bVar22 = bVar25 && bVar23;
    if (((uVar6 & 7) != 0) || (!bVar25 || !bVar23)) goto LAB_002079e4;
    p_Var19 = this->_vptr_Convolution_x86_fma[-3];
    iVar14 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var19);
    if (((iVar14 == 1) && (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var19) == 1))
       && (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) == 1 &&
            (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) == 1 &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 1)) &&
             (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 1)))) ||
           ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) == 1 &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) == 1)) &&
             (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 2)) &&
            (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 2)))))) {
      convolution_im2col_sgemm_transform_kernel_pack8to4_avx
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                 &this->weight_sgemm_data,num_input,
                 *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19),1,1);
      bVar23 = false;
    }
    else {
      pMVar13 = (Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19);
      iVar17 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19);
      iVar18 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var19);
      if (opt->use_sgemm_convolution == true) {
        convolution_im2col_sgemm_transform_kernel_pack8to4_avx
                  (pMVar13,&this->weight_sgemm_data,num_input,iVar17,iVar14,iVar18);
      }
      else {
        convolution_transform_kernel_packed_sse
                  (pMVar13,&this->weight_data_tm,num_input,iVar17,iVar14,iVar18,8,4);
      }
      bVar23 = false;
    }
LAB_00207d82:
    if ((bVar11) && (bVar22 != false)) {
      p_Var19 = this->_vptr_Convolution_x86_fma[-3];
      uVar15 = *(uint *)((long)&(this->weight_winograd23_data).d + (long)p_Var19);
      pOVar16 = (Option *)(ulong)uVar15;
      if (((uVar15 == 1) && (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var19) == 1)
          ) && (((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) == 1 &&
                   (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) == 1)) &&
                  (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 1)
                  ) && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 1))
                || (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) == 1 &&
                     (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) == 1))
                    && ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4))
                         == 2 && (*(int *)((long)&(this->weight_winograd43_data).data +
                                          (long)p_Var19) == 2)))))))) {
        iVar14 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19);
        uVar15 = 1;
        iVar17 = 1;
LAB_00207f97:
        convolution_im2col_sgemm_transform_kernel_pack4_sse
                  ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                   &this->weight_sgemm_data,num_input,iVar14,uVar15,iVar17);
      }
      else {
        if (opt->use_winograd_convolution == true) {
          bVar21 = opt->use_winograd23_convolution;
          if ((bVar21 == false) && (opt->use_winograd43_convolution == false)) {
            if ((uVar15 == 3) && (opt->use_winograd63_convolution != false)) {
LAB_00207e5f:
              if (((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var19) == 3) &&
                  (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) == 1 &&
                    (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) == 1)) &&
                   (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 1
                   )))) && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) ==
                            1)) {
                bVar25 = opt->use_winograd63_convolution;
                if (((bVar25 != true) || ((int)num_input < 8)) ||
                   ((iVar14 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19),
                    0x18 < iVar14 - 8U || (0x20 < num_input)))) {
                  if (opt->use_winograd43_convolution != false) {
                    if ((int)num_input < 8) {
                      if (bVar21 == false && bVar25 == false) {
                        iVar14 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19);
                        goto LAB_00208b7e;
                      }
                    }
                    else {
                      iVar14 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19);
                      if (((bVar21 | bVar25) != 1) || (7 < iVar14)) {
LAB_00208b7e:
                        conv3x3s1_winograd43_transform_kernel_pack4_sse
                                  ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                                   &this->weight_winograd43_data,num_input,iVar14,pOVar16);
                        goto LAB_00207fd6;
                      }
                    }
LAB_00208ac9:
                    conv3x3s1_winograd23_transform_kernel_pack4_sse
                              ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                               &this->weight_winograd23_data,num_input,
                               *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19),
                               pOVar16);
                    goto LAB_00207fd6;
                  }
                  if (bVar21 != false) goto LAB_00208ac9;
                  iVar14 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19);
                }
                conv3x3s1_winograd63_transform_kernel_pack4_sse
                          ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                           &this->weight_winograd63_data,num_input,iVar14,pOVar16);
                goto LAB_00207fd6;
              }
            }
          }
          else if (uVar15 == 3) goto LAB_00207e5f;
        }
        iVar14 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19);
        if (iVar14 == 1) {
          iVar14 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19);
          if (iVar14 == 1) {
            if ((((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 1)
                 && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 1)) &&
                ((0xb < (int)num_input ||
                 (0xb < *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19))))) ||
               (((1 < *(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) ||
                 (1 < *(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19))) &&
                ((0xf < (int)num_input ||
                 (0xf < *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19)))))))
            goto LAB_00207f5d;
          }
          else {
LAB_00207f51:
            if (1 < iVar14) goto LAB_00207f56;
          }
        }
        else {
          if (iVar14 < 2) {
            iVar14 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19);
            goto LAB_00207f51;
          }
LAB_00207f56:
          if ((int)num_input < 0x10) {
            bVar21 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19) < 0x10;
          }
          else {
LAB_00207f5d:
            bVar21 = false;
          }
          if ((opt->use_sgemm_convolution == true) && (!bVar21)) {
            iVar14 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19);
            iVar17 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var19);
            goto LAB_00207f97;
          }
        }
        convolution_transform_kernel_packed_sse
                  ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                   &this->weight_data_tm,num_input,
                   *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19),uVar15,
                   *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var19),4,4);
      }
    }
LAB_00207fd6:
    if ((bVar22 & bVar24) == 1) {
      p_Var19 = this->_vptr_Convolution_x86_fma[-3];
      iVar14 = *(int *)((long)&(this->weight_winograd23_data).d + (long)p_Var19);
      if (iVar14 == 3) {
        if ((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var19) != 3) ||
           (((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) != 1 ||
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) != 1)) ||
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) != 1)) ||
             (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) != 1)) &&
            (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) != 1 ||
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) != 1)) ||
             ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) != 2 ||
              (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) != 2))))))))
        goto LAB_0020811b;
        iVar17 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19);
        iVar14 = 3;
        iVar18 = 3;
      }
      else {
        if (((iVar14 == 1) &&
            (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var19) == 1)) &&
           (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) == 1 &&
             (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) == 1 &&
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 1))
              && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 1)))) ||
            ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) == 1 &&
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) == 1)) &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 2)) &&
             (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 2)))))) {
          iVar17 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19);
          iVar14 = 1;
          iVar18 = 1;
LAB_002081bc:
          convolution_im2col_sgemm_transform_kernel_pack1to4_sse
                    ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                     &this->weight_sgemm_data,num_input,iVar17,iVar14,iVar18);
          goto LAB_002081f6;
        }
LAB_0020811b:
        iVar17 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19);
        if (iVar17 == 1) {
          iVar17 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19);
          if (iVar17 == 1) {
            if ((((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 1)
                 && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 1)) &&
                ((0xb < (int)num_input ||
                 (0xb < *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19))))) ||
               (((1 < *(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) ||
                 (1 < *(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19))) &&
                ((0xf < (int)num_input ||
                 (0xf < *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19)))))))
            goto LAB_00208183;
          }
          else {
LAB_00208179:
            if (1 < iVar17) goto LAB_0020817e;
          }
        }
        else {
          if (iVar17 < 2) {
            iVar17 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19);
            goto LAB_00208179;
          }
LAB_0020817e:
          if ((int)num_input < 0x10) {
            bVar21 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19) < 0x10;
          }
          else {
LAB_00208183:
            bVar21 = false;
          }
          if ((opt->use_sgemm_convolution == true) && (!bVar21)) {
            iVar17 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19);
            iVar18 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var19);
            goto LAB_002081bc;
          }
        }
        iVar17 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19);
        iVar18 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var19);
      }
      convolution_transform_kernel_packed_sse
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                 &this->weight_data_tm,num_input,iVar17,iVar14,iVar18,1,4);
    }
  }
LAB_002081f6:
  if ((bVar11) && (bVar23 != false)) {
    p_Var19 = this->_vptr_Convolution_x86_fma[-3];
    uVar15 = *(uint *)((long)&(this->weight_winograd23_data).d + (long)p_Var19);
    if (((uVar15 == 1) && (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var19) == 1))
       && (((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) == 1 &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) == 1)) &&
             (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 1)) &&
            (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 1)) ||
           ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) == 1 &&
              (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) == 1)) &&
             (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 2)) &&
            (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 2)))))) {
      iVar14 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19);
      uVar15 = 1;
      iVar17 = 1;
LAB_00208394:
      convolution_im2col_sgemm_transform_kernel_pack4to1_sse
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                 &this->weight_sgemm_data,num_input,iVar14,uVar15,iVar17);
    }
    else if (((opt->use_winograd_convolution == true) && (uVar15 == 3)) &&
            (((opt->use_winograd63_convolution != false &&
              (((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var19) == 3 &&
                (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) == 1)) &&
               (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) == 1)))) &&
             ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 1 &&
              (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 1)))))) {
      conv3x3s1_winograd63_transform_kernel_pack4to1_sse
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                 &this->weight_winograd63_data,num_input,
                 *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19),
                 (Option *)(ulong)uVar15);
    }
    else {
      iVar14 = *(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19);
      if (iVar14 == 1) {
        iVar14 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19);
        if (iVar14 == 1) {
          if ((((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 1)
               && (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 1)) &&
              ((0xb < (int)num_input ||
               (0xb < *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19))))) ||
             (((1 < *(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) ||
               (1 < *(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19))) &&
              ((0xf < (int)num_input ||
               (0xf < *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19)))))))
          goto LAB_0020835e;
        }
        else {
LAB_00208354:
          if (1 < iVar14) goto LAB_00208359;
        }
      }
      else {
        if (iVar14 < 2) {
          iVar14 = *(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19);
          goto LAB_00208354;
        }
LAB_00208359:
        if ((int)num_input < 0x10) {
          bVar11 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19) < 0x10;
        }
        else {
LAB_0020835e:
          bVar11 = false;
        }
        if ((opt->use_sgemm_convolution == true) && (!bVar11)) {
          iVar14 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19);
          iVar17 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var19);
          goto LAB_00208394;
        }
      }
      convolution_transform_kernel_packed_sse
                ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                 &this->weight_data_tm,num_input,
                 *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19),uVar15,
                 *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var19),4,1);
    }
  }
  if ((bVar24 & bVar23) != 1) goto LAB_002085de;
  p_Var19 = this->_vptr_Convolution_x86_fma[-3];
  uVar15 = *(uint *)((long)&(this->weight_winograd23_data).d + (long)p_Var19);
  if (((uVar15 == 1) && (*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var19) == 1)) &&
     (((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) == 1 &&
       (((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) == 1 &&
         (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 1)) &&
        (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 1)))) ||
      ((((*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) == 1 &&
         (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) == 1)) &&
        (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 2)) &&
       (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 2)))))) {
    iVar14 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19);
    uVar15 = 1;
    iVar17 = 1;
  }
  else {
    if (opt->use_winograd_convolution == true) {
      bVar24 = opt->use_winograd23_convolution;
      if ((bool)bVar24 == false) {
        if ((uVar15 == 3) && (opt->use_winograd43_convolution != false)) goto LAB_00208488;
      }
      else if (uVar15 == 3) {
LAB_00208488:
        if ((((*(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var19) == 3) &&
             (*(int *)(&(this->weight_winograd23_data).field_0x3c + (long)p_Var19) == 1)) &&
            (*(int *)((long)&(this->weight_winograd23_data).cstep + (long)p_Var19) == 1)) &&
           ((*(int *)((long)&(this->weight_winograd23_data).cstep + (long)(p_Var19 + 4)) == 1 &&
            (*(int *)((long)&(this->weight_winograd43_data).data + (long)p_Var19) == 1)))) {
          iVar14 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19);
          if ((opt->use_winograd43_convolution == true) && (0xf < (int)num_input)) {
            bVar24 = iVar14 < 0x10 & bVar24;
          }
          if (bVar24 == 0) {
            conv3x3s1_winograd43_transform_kernel_sse
                      ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                       &this->weight_winograd43_data,num_input,iVar14,(Option *)(ulong)uVar15);
          }
          else {
            conv3x3s1_winograd23_transform_kernel_sse
                      ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
                       &this->weight_winograd23_data,num_input,iVar14,(Option *)(ulong)uVar15);
          }
          goto LAB_002085de;
        }
      }
    }
    if (opt->use_sgemm_convolution != true) {
      if (p_Var19 != (_func_int *)0xfffffffffffffeb0) {
        piVar2 = *(int **)((long)&(this->weight_winograd63_data).c + (long)p_Var19);
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + 1;
          UNLOCK();
        }
        piVar2 = (this->weight_data_tm).refcount;
        if (piVar2 != (int *)0x0) {
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            pvVar4 = (this->weight_data_tm).data;
            pAVar3 = (this->weight_data_tm).allocator;
            if (pAVar3 == (Allocator *)0x0) {
              if (pvVar4 != (void *)0x0) {
                free(pvVar4);
              }
            }
            else {
              (*pAVar3->_vptr_Allocator[3])();
            }
          }
        }
        (this->weight_data_tm).cstep = 0;
        *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
        (this->weight_data_tm).data = (void *)0x0;
        (this->weight_data_tm).refcount = (int *)0x0;
        (this->weight_data_tm).dims = 0;
        (this->weight_data_tm).w = 0;
        (this->weight_data_tm).h = 0;
        (this->weight_data_tm).d = 0;
        (this->weight_data_tm).c = 0;
        p_Var1 = (_func_int *)((long)&(this->weight_winograd63_data).h + (long)p_Var19);
        piVar2 = *(int **)(p_Var1 + 8);
        (this->weight_data_tm).data = *(void **)p_Var1;
        (this->weight_data_tm).refcount = piVar2;
        (this->weight_data_tm).elemsize =
             *(size_t *)((long)&(this->weight_winograd63_data).cstep + (long)p_Var19);
        (this->weight_data_tm).elempack =
             *(int *)((long)&this->convolution_dilation1 + (long)p_Var19);
        (this->weight_data_tm).allocator =
             *(Allocator **)((long)&(this->scale_in_data).data + (long)p_Var19);
        p_Var1 = (_func_int *)((long)&(this->scale_in_data).refcount + (long)p_Var19);
        uVar7 = *(undefined8 *)p_Var1;
        uVar8 = *(undefined8 *)(p_Var1 + 8);
        (this->weight_data_tm).dims = (int)uVar7;
        (this->weight_data_tm).w = (int)((ulong)uVar7 >> 0x20);
        (this->weight_data_tm).h = (int)uVar8;
        (this->weight_data_tm).d = (int)((ulong)uVar8 >> 0x20);
        (this->weight_data_tm).c = *(int *)((long)&(this->scale_in_data).elempack + (long)p_Var19);
        (this->weight_data_tm).cstep =
             *(size_t *)((long)&(this->scale_in_data).allocator + (long)p_Var19);
      }
      goto LAB_002085de;
    }
    iVar14 = *(int *)((long)&(this->weight_winograd23_data).h + (long)p_Var19);
    iVar17 = *(int *)((long)&(this->weight_winograd23_data).c + (long)p_Var19);
  }
  convolution_im2col_sgemm_transform_kernel_sse
            ((Mat *)((long)&(this->weight_winograd63_data).h + (long)p_Var19),
             &this->weight_sgemm_data,num_input,iVar14,uVar15,iVar17);
LAB_002085de:
  if (opt->lightmode == true) {
    p_Var19 = this->_vptr_Convolution_x86_fma[-3];
    piVar2 = *(int **)((long)&(this->weight_winograd63_data).c + (long)p_Var19);
    if (piVar2 != (int *)0x0) {
      LOCK();
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        pvVar4 = *(void **)((long)&(this->weight_winograd63_data).h + (long)p_Var19);
        plVar5 = *(long **)((long)&(this->scale_in_data).data + (long)p_Var19);
        if (plVar5 == (long *)0x0) {
          if (pvVar4 != (void *)0x0) {
            free(pvVar4);
          }
        }
        else {
          (**(code **)(*plVar5 + 0x18))();
        }
      }
    }
    *(undefined8 *)((long)&(this->scale_in_data).allocator + (long)p_Var19) = 0;
    *(undefined8 *)(&(this->weight_winograd63_data).field_0x3c + (long)p_Var19) = 0;
    *(undefined8 *)((long)&(this->weight_winograd63_data).cstep + (long)(p_Var19 + 4)) = 0;
    *(undefined8 *)((long)&(this->weight_winograd63_data).h + (long)p_Var19) = 0;
    *(undefined8 *)((long)&(this->weight_winograd63_data).c + (long)p_Var19) = 0;
    *(undefined8 *)((long)&(this->scale_in_data).refcount + (long)p_Var19) = 0;
    *(undefined8 *)((long)&(this->scale_in_data).elemsize + (long)p_Var19) = 0;
    *(undefined4 *)((long)&(this->scale_in_data).elempack + (long)p_Var19) = 0;
  }
  return 0;
}

Assistant:

int Convolution_x86_fma::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        convolution_dilation1 = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, 1);
        pd.set(12, 1);
        pd.set(3, 1);  // stride_w
        pd.set(13, 1); // stride_h
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, weight_data_size);

        convolution_dilation1->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }

        convolution_dilation1->create_pipeline(opt);

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if ((opt.use_winograd63_convolution && num_input >= 32 && num_output >= 32 && num_input <= 128 && num_output <= 128) || (!opt.use_winograd43_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd63_transform_kernel_pack16_avx512(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if ((opt.use_winograd43_convolution && num_input >= 32 && num_output >= 32) || (!opt.use_winograd63_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd43_transform_kernel_pack16_avx512(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else // if (opt.use_winograd23_convolution)
                conv3x3s1_winograd23_transform_kernel_pack16_avx512(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 8 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 16 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to8_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to8_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to8_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 4 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 16 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 1 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 16 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to1_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to1_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if (opt.use_winograd_convolution && opt.use_winograd63_convolution)
            {
                conv3x3s1_winograd63_transform_kernel_pack16to1_avx512(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to1_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

#endif // __AVX512F__

    // pack8
    if (elempack == 8 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input > 8 || num_output > 8))
        {
            if ((opt.use_winograd63_convolution && num_input >= 16 && num_output >= 16 && num_input <= 64 && num_output <= 64) || (!opt.use_winograd43_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd63_transform_kernel_pack8_avx(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if ((opt.use_winograd43_convolution && num_input >= 16 && num_output >= 16) || (!opt.use_winograd63_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd43_transform_kernel_pack8_avx(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else // if (opt.use_winograd23_convolution)
                conv3x3s1_winograd23_transform_kernel_pack8_avx(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack4to8
    if (elempack == 4 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack1to8
    if (elempack == 1 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack8to4
    if (elempack == 8 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack8to1
    if (elempack == 8 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if (opt.use_winograd_convolution && opt.use_winograd63_convolution)
            {
                conv3x3s1_winograd63_transform_kernel_pack8to1_avx(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }
#endif // __AVX__

    // pack4
    if (elempack == 4 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if ((opt.use_winograd63_convolution && num_input >= 8 && num_output >= 8 && num_input <= 32 && num_output <= 32) || (!opt.use_winograd43_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd63_transform_kernel_pack4_sse(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if ((opt.use_winograd43_convolution && num_input >= 8 && num_output >= 8) || (!opt.use_winograd63_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd43_transform_kernel_pack4_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else // if (opt.use_winograd23_convolution)
                conv3x3s1_winograd23_transform_kernel_pack4_sse(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else
        {
            bool prefer_sgemm = (dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input >= 12 || num_output >= 12))
                                || (dilation_w == 1 && dilation_h == 1 && (stride_w >= 2 || stride_h >= 2) && (num_input >= 16 || num_output >= 16))
                                || ((dilation_w >= 2 || dilation_h >= 2) && (num_input >= 16 || num_output >= 16));

            if (opt.use_sgemm_convolution && prefer_sgemm)
            {
                convolution_im2col_sgemm_transform_kernel_pack4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
    }

    // pack1to4
    if (elempack == 1 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else
        {
            bool prefer_sgemm = (dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input >= 12 || num_output >= 12))
                                || (dilation_w == 1 && dilation_h == 1 && (stride_w >= 2 || stride_h >= 2) && (num_input >= 16 || num_output >= 16))
                                || ((dilation_w >= 2 || dilation_h >= 2) && (num_input >= 16 || num_output >= 16));

            if (opt.use_sgemm_convolution && prefer_sgemm)
            {
                convolution_im2col_sgemm_transform_kernel_pack1to4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
    }

    // pack4to1
    if (elempack == 4 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to1_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to1_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd63_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd63_transform_kernel_pack4to1_sse(weight_data, weight_winograd63_data, num_input, num_output, opt);
        }
        else
        {
            bool prefer_sgemm = (dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input >= 12 || num_output >= 12))
                                || (dilation_w == 1 && dilation_h == 1 && (stride_w >= 2 || stride_h >= 2) && (num_input >= 16 || num_output >= 16))
                                || ((dilation_w >= 2 || dilation_h >= 2) && (num_input >= 16 || num_output >= 16));

            if (opt.use_sgemm_convolution && prefer_sgemm)
            {
                convolution_im2col_sgemm_transform_kernel_pack4to1_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
    }
#endif // __SSE2__

    // pack1
    if (elempack == 1 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if ((opt.use_winograd43_convolution && num_input >= 16 && num_output >= 16) || !opt.use_winograd23_convolution)
            {
                conv3x3s1_winograd43_transform_kernel_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
            }
            else
            {
                conv3x3s1_winograd23_transform_kernel_sse(weight_data, weight_winograd23_data, num_input, num_output, opt);
            }
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            weight_data_tm = weight_data;
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}